

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convertbmp.c
# Opt level: O2

opj_image_t * bmp8toimage(OPJ_UINT8 *pData,OPJ_UINT32 stride,opj_image_t *image,OPJ_UINT8 **pLUT)

{
  byte bVar1;
  uint uVar2;
  opj_image_comp_t *poVar3;
  OPJ_UINT8 *pOVar4;
  OPJ_UINT8 *pOVar5;
  OPJ_UINT8 *pOVar6;
  OPJ_INT32 *pOVar7;
  OPJ_INT32 *pOVar8;
  OPJ_UINT32 OVar9;
  OPJ_UINT8 *pOVar10;
  OPJ_UINT32 x;
  ulong uVar11;
  OPJ_INT32 *pOVar12;
  OPJ_UINT32 x_1;
  bool bVar13;
  
  poVar3 = image->comps;
  uVar2 = poVar3->w;
  OVar9 = poVar3->h;
  pOVar10 = pData + (OVar9 - 1) * stride;
  if (image->numcomps == 1) {
    pOVar8 = poVar3->data;
    pOVar4 = *pLUT;
    while (bVar13 = OVar9 != 0, OVar9 = OVar9 - 1, bVar13) {
      for (uVar11 = 0; uVar2 != uVar11; uVar11 = uVar11 + 1) {
        pOVar8[uVar11] = (uint)pOVar4[pOVar10[uVar11]];
      }
      pOVar10 = pOVar10 + (int)-stride;
      pOVar8 = pOVar8 + (int)uVar2;
    }
  }
  else {
    pOVar8 = poVar3->data;
    pOVar12 = poVar3[1].data;
    pOVar7 = poVar3[2].data;
    pOVar4 = *pLUT;
    pOVar5 = pLUT[1];
    pOVar6 = pLUT[2];
    while (bVar13 = OVar9 != 0, OVar9 = OVar9 - 1, bVar13) {
      for (uVar11 = 0; uVar2 != uVar11; uVar11 = uVar11 + 1) {
        bVar1 = pOVar10[uVar11];
        pOVar8[uVar11] = (uint)pOVar4[bVar1];
        pOVar12[uVar11] = (uint)pOVar5[bVar1];
        pOVar7[uVar11] = (uint)pOVar6[bVar1];
      }
      pOVar10 = pOVar10 + (int)-stride;
      pOVar7 = pOVar7 + (int)uVar2;
      pOVar12 = pOVar12 + (int)uVar2;
      pOVar8 = pOVar8 + (int)uVar2;
    }
  }
  return image;
}

Assistant:

static opj_image_t* bmp8toimage(const OPJ_UINT8* pData, OPJ_UINT32 stride,
                                opj_image_t* image, OPJ_UINT8 const* const* pLUT)
{
    OPJ_UINT32 width, height;
    const OPJ_UINT8 *pSrc = NULL;

    width  = image->comps[0].w;
    height = image->comps[0].h;

    pSrc = pData + (height - 1U) * stride;
    if (image->numcomps == 1U) {
        opj_applyLUT8u_8u32s_C1R(pSrc, -(OPJ_INT32)stride, image->comps[0].data,
                                 (OPJ_INT32)width, pLUT[0], width, height);
    } else {
        OPJ_INT32* pDst[3];
        OPJ_INT32  pDstStride[3];

        pDst[0] = image->comps[0].data;
        pDst[1] = image->comps[1].data;
        pDst[2] = image->comps[2].data;
        pDstStride[0] = (OPJ_INT32)width;
        pDstStride[1] = (OPJ_INT32)width;
        pDstStride[2] = (OPJ_INT32)width;
        opj_applyLUT8u_8u32s_C1P3R(pSrc, -(OPJ_INT32)stride, pDst, pDstStride, pLUT,
                                   width, height);
    }
    return image;
}